

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlElementContentPtr xmlCopyDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  _xmlElementContent *p_Var1;
  xmlElementContentPtr pxVar2;
  xmlChar *pxVar3;
  xmlElementContentPtr pxVar4;
  _xmlElementContent *p_Var5;
  _xmlDict *dict;
  
  if (cur == (xmlElementContentPtr)0x0) {
    pxVar2 = (xmlElementContentPtr)0x0;
  }
  else {
    if (doc == (xmlDocPtr)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = doc->dict;
    }
    pxVar2 = (xmlElementContentPtr)(*xmlMalloc)(0x30);
    if (pxVar2 == (xmlElementContentPtr)0x0) {
      pxVar2 = (xmlElementContentPtr)0x0;
LAB_0018ee07:
      xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    }
    else {
      pxVar2->parent = (_xmlElementContent *)0x0;
      pxVar2->prefix = (xmlChar *)0x0;
      pxVar2->c1 = (_xmlElementContent *)0x0;
      pxVar2->c2 = (_xmlElementContent *)0x0;
      pxVar2->type = 0;
      pxVar2->ocur = 0;
      pxVar2->name = (xmlChar *)0x0;
      pxVar2->type = cur->type;
      pxVar2->ocur = cur->ocur;
      pxVar3 = cur->name;
      if (pxVar3 != (xmlChar *)0x0) {
        if (dict == (xmlDictPtr)0x0) {
          pxVar3 = xmlStrdup(pxVar3);
        }
        else {
          pxVar3 = xmlDictLookup(dict,pxVar3,-1);
        }
        pxVar2->name = pxVar3;
      }
      pxVar3 = cur->prefix;
      if (pxVar3 != (xmlChar *)0x0) {
        if (dict == (xmlDictPtr)0x0) {
          pxVar3 = xmlStrdup(pxVar3);
        }
        else {
          pxVar3 = xmlDictLookup(dict,pxVar3,-1);
        }
        pxVar2->prefix = pxVar3;
      }
      if (cur->c1 != (xmlElementContentPtr)0x0) {
        pxVar4 = xmlCopyDocElementContent(doc,cur->c1);
        pxVar2->c1 = pxVar4;
      }
      if (pxVar2->c1 != (_xmlElementContent *)0x0) {
        pxVar2->c1->parent = pxVar2;
      }
      pxVar4 = pxVar2;
      for (p_Var1 = cur->c2; p_Var1 != (_xmlElementContent *)0x0; p_Var1 = p_Var1->c2) {
        p_Var5 = (_xmlElementContent *)(*xmlMalloc)(0x30);
        if (p_Var5 == (_xmlElementContent *)0x0) goto LAB_0018ee07;
        p_Var5->parent = (_xmlElementContent *)0x0;
        p_Var5->prefix = (xmlChar *)0x0;
        p_Var5->c1 = (_xmlElementContent *)0x0;
        p_Var5->c2 = (_xmlElementContent *)0x0;
        p_Var5->type = 0;
        p_Var5->ocur = 0;
        p_Var5->name = (xmlChar *)0x0;
        p_Var5->type = p_Var1->type;
        p_Var5->ocur = p_Var1->ocur;
        pxVar4->c2 = p_Var5;
        p_Var5->parent = pxVar4;
        pxVar3 = p_Var1->name;
        if (pxVar3 != (xmlChar *)0x0) {
          if (dict == (xmlDictPtr)0x0) {
            pxVar3 = xmlStrdup(pxVar3);
          }
          else {
            pxVar3 = xmlDictLookup(dict,pxVar3,-1);
          }
          p_Var5->name = pxVar3;
        }
        pxVar3 = p_Var1->prefix;
        if (pxVar3 != (xmlChar *)0x0) {
          if (dict == (xmlDictPtr)0x0) {
            pxVar3 = xmlStrdup(pxVar3);
          }
          else {
            pxVar3 = xmlDictLookup(dict,pxVar3,-1);
          }
          p_Var5->prefix = pxVar3;
        }
        if (p_Var1->c1 != (xmlElementContentPtr)0x0) {
          pxVar4 = xmlCopyDocElementContent(doc,p_Var1->c1);
          p_Var5->c1 = pxVar4;
        }
        if (p_Var5->c1 != (_xmlElementContent *)0x0) {
          p_Var5->c1->parent = pxVar2;
        }
        pxVar4 = p_Var5;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlElementContentPtr
xmlCopyDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlElementContentPtr ret = NULL, prev = NULL, tmp;
    xmlDictPtr dict = NULL;

    if (cur == NULL) return(NULL);

    if (doc != NULL)
        dict = doc->dict;

    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = cur->type;
    ret->ocur = cur->ocur;
    if (cur->name != NULL) {
	if (dict)
	    ret->name = xmlDictLookup(dict, cur->name, -1);
	else
	    ret->name = xmlStrdup(cur->name);
    }

    if (cur->prefix != NULL) {
	if (dict)
	    ret->prefix = xmlDictLookup(dict, cur->prefix, -1);
	else
	    ret->prefix = xmlStrdup(cur->prefix);
    }
    if (cur->c1 != NULL)
        ret->c1 = xmlCopyDocElementContent(doc, cur->c1);
    if (ret->c1 != NULL)
	ret->c1->parent = ret;
    if (cur->c2 != NULL) {
        prev = ret;
	cur = cur->c2;
	while (cur != NULL) {
	    tmp = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
	    if (tmp == NULL) {
		xmlVErrMemory(NULL, "malloc failed");
		return(ret);
	    }
	    memset(tmp, 0, sizeof(xmlElementContent));
	    tmp->type = cur->type;
	    tmp->ocur = cur->ocur;
	    prev->c2 = tmp;
	    tmp->parent = prev;
	    if (cur->name != NULL) {
		if (dict)
		    tmp->name = xmlDictLookup(dict, cur->name, -1);
		else
		    tmp->name = xmlStrdup(cur->name);
	    }

	    if (cur->prefix != NULL) {
		if (dict)
		    tmp->prefix = xmlDictLookup(dict, cur->prefix, -1);
		else
		    tmp->prefix = xmlStrdup(cur->prefix);
	    }
	    if (cur->c1 != NULL)
	        tmp->c1 = xmlCopyDocElementContent(doc,cur->c1);
	    if (tmp->c1 != NULL)
		tmp->c1->parent = ret;
	    prev = tmp;
	    cur = cur->c2;
	}
    }
    return(ret);
}